

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::dxt_hc::alpha_cluster>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  alpha_cluster *local_38;
  alpha_cluster *pDst;
  alpha_cluster *pSrc_end;
  alpha_cluster *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  local_38 = (alpha_cluster *)pDst_void;
  for (pSrc_end = (alpha_cluster *)pSrc_void;
      pSrc_end != (alpha_cluster *)((long)pSrc_void + (ulong)num * 0x90); pSrc_end = pSrc_end + 1) {
    dxt_hc::alpha_cluster::alpha_cluster(local_38,pSrc_end);
    dxt_hc::alpha_cluster::~alpha_cluster(pSrc_end);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }